

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# State.hpp
# Opt level: O2

IterTraits<Lib::MappingIterator<Lib::CoproductIter<Lib::IterTraits<Lib::FilteredIterator<Lib::IterTraits<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:107:26),_false>_>,_Lib::IterTraits<Lib::FilteredIterator<Lib::IterTraits<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:107:26),_false>_>,_Lib::IterTraits<Lib::FilteredIterator<Lib::IterTraits<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:107:26),_false>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:216:22),_Kernel::SelectedSummand>_>
* __thiscall
Kernel::AlascaState::maxSummands
          (IterTraits<Lib::MappingIterator<Lib::CoproductIter<Lib::IterTraits<Lib::FilteredIterator<Lib::IterTraits<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:107:26),_false>_>,_Lib::IterTraits<Lib::FilteredIterator<Lib::IterTraits<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:107:26),_false>_>,_Lib::IterTraits<Lib::FilteredIterator<Lib::IterTraits<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:107:26),_false>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:216:22),_Kernel::SelectedSummand>_>
           *__return_storage_ptr__,AlascaState *this,SelectedLiteral *sel_lit,SelectionCriterion sel
          )

{
  anon_class_16_2_633bab87 f;
  SelectionCriterion local_154;
  SelectedLiteral local_150;
  undefined1 local_120 [132];
  Lib local_9c [49];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_6b [10];
  Coproduct<Lib::IterTraits<Lib::FilteredIterator<Lib::IterTraits<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:107:26),_false>_>,_Lib::IterTraits<Lib::FilteredIterator<Lib::IterTraits<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:107:26),_false>_>,_Lib::IterTraits<Lib::FilteredIterator<Lib::IterTraits<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:107:26),_false>_>_>
  *is;
  
  f.sel = &local_154;
  f.this = this;
  local_154 = sel;
  Lib::
  Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>>>
  ::
  applyCo<Kernel::AlascaState::maxSummands(Kernel::SelectedLiteral,Kernel::OrderingUtils::SelectionCriterion)::_lambda(auto:1&)_1_>
            ((ResultOf<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Coproduct_hpp:601:3),_Constant<0>_>_conflict7
              *)local_9c,
             (Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>>>
              *)&(sel_lit->interpreted).
                 super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                 ._elem,f);
  Lib::
  coproductIter<Lib::IterTraits<Lib::FilteredIterator<Lib::IterTraits<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,Kernel::OrderingUtils::maxElems<Kernel::AlascaState::maxSummandIndices<Kernel::NumTraits<Kernel::IntegerConstantType>>(Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>>const&,Kernel::OrderingUtils::SelectionCriterion)::_lambda(unsigned_int,unsigned_int)_1_,Kernel::AlascaState::maxSummandIndices<Kernel::NumTraits<Kernel::IntegerConstantType>>(Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>>const&,Kernel::OrderingUtils::SelectionCriterion)::_lambda(unsigned_int)_1_>(unsigned_int,Kernel::AlascaState::maxSummandIndices<Kernel::NumTraits<Kernel::IntegerConstantType>>(Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>>const&,Kernel::OrderingUtils::SelectionCriterion)::_lambda(unsigned_int,unsigned_int)_1_,Kernel::AlascaState::maxSummandIndices<Kernel::NumTraits<Kernel::IntegerConstantType>>(Kernel::AlascaLiteral<Ker___l::RealConstantType>>const&,Kernel::OrderingUtils::SelectionCriterion)::_lambda(auto:1&)_1_,false>>>
            ((IterTraits<Lib::CoproductIter<Lib::IterTraits<Lib::FilteredIterator<Lib::IterTraits<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:107:26),_false>_>,_Lib::IterTraits<Lib::FilteredIterator<Lib::IterTraits<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:107:26),_false>_>,_Lib::IterTraits<Lib::FilteredIterator<Lib::IterTraits<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:107:26),_false>_>_>_>
              *)local_120,local_9c,is);
  SelectedLiteral::SelectedLiteral(&local_150,sel_lit);
  Lib::
  IterTraits<Lib::CoproductIter<Lib::IterTraits<Lib::FilteredIterator<Lib::IterTraits<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,Kernel::OrderingUtils::maxElems<Kernel::AlascaState::maxSummandIndices<Kernel::NumTraits<Kernel::IntegerConstantType>>(Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>>const&,Kernel::OrderingUtils::SelectionCriterion)::{lambda(unsigned_int,unsigned_int)#1},Kernel::AlascaState::maxSummandIndices<Kernel::NumTraits<Kernel::IntegerConstantType>>(Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>>const&,Kernel::OrderingUtils::SelectionCriterion)::{lambda(unsigned_int)#1}>(unsigned_int,Kernel::AlascaState::maxSummandIndices<Kernel::NumTraits<Kernel::IntegerConstantType>>(Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>>const&,Kernel::OrderingUtils::SelectionCriterion)::{lambda(unsigned_int,unsigned_int)#1},Kernel::AlascaState::maxSummandIndices<Kernel::NumTraits<Kernel::IntegerConstantType>>(Kernel::A...::RealConstantType>>const&,Kernel::OrderingUtils::SelectionCriterion)::{lambda(auto:1&)#1},false>>>>
  ::
  map<Kernel::AlascaState::maxSummands(Kernel::SelectedLiteral,Kernel::OrderingUtils::SelectionCriterion)::_lambda(auto:1)_1_>
            (__return_storage_ptr__,local_120,(anon_class_48_1_f93f0412_for__func *)&local_150);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_120 + 0x31));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_6b);
  return __return_storage_ptr__;
}

Assistant:

auto maxSummands(SelectedLiteral sel_lit , SelectionCriterion sel) 
    { return coproductIter(sel_lit.interpreted.unwrap()
                .applyCo([&](auto& lit) 
                       { return maxSummandIndices(lit, sel); }))
                .map([=](auto i) 
                     { return SelectedSummand(sel_lit, i); }); }